

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O0

int FmsIntersectSorted(int n1,int n2,FmsInt *face1,FmsInt *face2,FmsInt *edge_common)

{
  int i2;
  int i1;
  FmsInt e2;
  FmsInt e1;
  int num_common;
  FmsInt *edge_common_local;
  FmsInt *face2_local;
  FmsInt *face1_local;
  int n2_local;
  int n1_local;
  
  num_common = 0;
  e1 = *face1;
  e2 = *face2;
  i1 = 0;
  i2 = 0;
  do {
    while (e1 != e2) {
      if (e1 < e2) {
        do {
          i1 = i1 + 1;
          if (i1 == n1) {
            return num_common;
          }
          e1 = face1[i1];
        } while (e1 < e2);
      }
      else {
        do {
          i2 = i2 + 1;
          if (i2 == n2) {
            return num_common;
          }
          e2 = face2[i2];
        } while (e2 < e1);
      }
    }
    num_common = num_common + 1;
    *edge_common = e1;
    do {
      i2 = i2 + 1;
      if (i2 == n2) {
        return num_common;
      }
      e2 = face2[i2];
    } while (e1 == e2);
    do {
      i1 = i1 + 1;
      if (i1 == n1) {
        return num_common;
      }
      e1 = face1[i1];
    } while (e1 < e2);
  } while( true );
}

Assistant:

static inline int FmsIntersectSorted(int n1, int n2, FmsInt *face1,
                                     FmsInt *face2, FmsInt *edge_common) {
  int num_common = 0;
  FmsInt e1 = face1[0], e2 = face2[0];
  for (int i1 = 0, i2 = 0; 1; ) {
    if (e1 == e2) {
      num_common++;
      *edge_common = e1;
      do {
        if (++i2 == n2) { return num_common; }
        e2 = face2[i2];
      } while (e1 == e2);
      do {
        if (++i1 == n1) { return num_common; }
        e1 = face1[i1];
      } while (e1 < e2);
    } else if (e1 < e2) {
      do {
        if (++i1 == n1) { return num_common; }
        e1 = face1[i1];
      } while (e1 < e2);
    } else { // e1 > e2
      do {
        if (++i2 == n2) { return num_common; }
        e2 = face2[i2];
      } while (e1 > e2);
    }
  }
  // not reachable
}